

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReadMessage.cpp
# Opt level: O3

string * __thiscall
ReadMessage::execute_abi_cxx11_(string *__return_storage_ptr__,ReadMessage *this)

{
  char *pcVar1;
  char *pcVar2;
  long lVar3;
  char cVar4;
  long *plVar5;
  DIR *__dirp;
  dirent *pdVar6;
  long *plVar7;
  size_type *psVar8;
  string *psVar9;
  int iVar10;
  string result;
  string line;
  string dir;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  ifstream messageFile;
  undefined1 auStack_2e8 [8];
  _Alloc_hider local_2e0;
  char *local_2d8;
  char local_2d0;
  undefined7 uStack_2cf;
  undefined8 uStack_2c8;
  undefined1 *local_2c0;
  undefined8 local_2b8;
  undefined1 local_2b0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  string *local_280;
  long *local_278;
  long local_270;
  long local_268;
  long lStack_260;
  undefined1 *local_258 [2];
  undefined1 local_248 [16];
  long *local_238;
  long local_230;
  long local_228;
  long lStack_220;
  byte abStack_218 [488];
  
  local_2e0._M_p = &local_2d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"");
  std::__cxx11::string::string
            ((string *)&local_2c0,(this->super_ServerOperation).MESSAGEDIR,(allocator *)&local_2a0);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_2c0);
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_228 = *plVar7;
    lStack_220 = plVar5[3];
    local_238 = &local_228;
  }
  else {
    local_228 = *plVar7;
    local_238 = (long *)*plVar5;
  }
  local_230 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_238,(ulong)(this->User)._M_dataplus._M_p);
  local_278 = &local_268;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_268 = *plVar7;
    lStack_260 = plVar5[3];
  }
  else {
    local_268 = *plVar7;
    local_278 = (long *)*plVar5;
  }
  local_270 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if (local_238 != &local_228) {
    operator_delete(local_238);
  }
  if (local_2c0 != local_2b0) {
    operator_delete(local_2c0);
  }
  __dirp = opendir((char *)local_278);
  std::ifstream::ifstream(&local_238);
  local_2b8 = 0;
  local_2b0[0] = 0;
  local_2c0 = local_2b0;
  local_280 = __return_storage_ptr__;
  if (__dirp == (DIR *)0x0) {
    pcVar1 = (this->super_ServerOperation).FAILURE;
    pcVar2 = (char *)(this->super_ServerOperation).statusMessage._M_string_length;
    strlen(pcVar1);
    std::__cxx11::string::_M_replace
              ((ulong)&(this->super_ServerOperation).statusMessage,0,pcVar2,(ulong)pcVar1);
    closedir((DIR *)0x0);
    std::operator+(&local_2a0,"No such User \"",&this->User);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_2a0);
    psVar9 = local_280;
    (local_280->_M_dataplus)._M_p = (pointer)&local_280->field_2;
    psVar8 = (size_type *)(plVar5 + 2);
    if ((size_type *)*plVar5 == psVar8) {
      lVar3 = plVar5[3];
      (local_280->field_2)._M_allocated_capacity = *psVar8;
      *(long *)((long)&local_280->field_2 + 8) = lVar3;
    }
    else {
      (local_280->_M_dataplus)._M_p = (pointer)*plVar5;
      (local_280->field_2)._M_allocated_capacity = *psVar8;
    }
    local_280->_M_string_length = plVar5[1];
    *plVar5 = (long)psVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
      operator_delete(local_2a0._M_dataplus._M_p);
    }
  }
  else {
    iVar10 = 0;
    while( true ) {
      pdVar6 = readdir(__dirp);
      if ((pdVar6 == (dirent *)0x0) || (this->MessageNumber < iVar10)) break;
      if (pdVar6->d_type == '\b') {
        local_258[0] = local_248;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_258,local_278,(long)local_278 + local_270);
        std::__cxx11::string::append((char *)local_258);
        plVar5 = (long *)std::__cxx11::string::append((char *)local_258);
        psVar8 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_2a0.field_2._M_allocated_capacity = *psVar8;
          local_2a0.field_2._8_8_ = plVar5[3];
          local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
        }
        else {
          local_2a0.field_2._M_allocated_capacity = *psVar8;
          local_2a0._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_2a0._M_string_length = plVar5[1];
        *plVar5 = (long)psVar8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        std::ifstream::open((string *)&local_238,(_Ios_Openmode)&local_2a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
          operator_delete(local_2a0._M_dataplus._M_p);
        }
        if (local_258[0] != local_248) {
          operator_delete(local_258[0]);
        }
        cVar4 = std::__basic_file<char>::is_open();
        if (cVar4 != '\0') {
          iVar10 = iVar10 + 1;
          if (iVar10 == this->MessageNumber) {
            while ((abStack_218[local_238[-3]] & 2) == 0) {
              cVar4 = std::ios::widen((char)auStack_2e8 + (char)local_238[-3] + -0x50);
              std::getline<char,std::char_traits<char>,std::allocator<char>>
                        ((istream *)&local_238,(string *)&local_2c0,cVar4);
              std::__cxx11::string::_M_append((char *)&local_2e0,(ulong)local_2c0);
              std::__cxx11::string::append((char *)&local_2e0);
            }
          }
          std::ifstream::close();
        }
      }
    }
    iVar10 = std::__cxx11::string::compare((char *)&local_2e0);
    if (iVar10 == 0) {
      pcVar1 = (this->super_ServerOperation).FAILURE;
      pcVar2 = (char *)(this->super_ServerOperation).statusMessage._M_string_length;
      strlen(pcVar1);
      std::__cxx11::string::_M_replace
                ((ulong)&(this->super_ServerOperation).statusMessage,0,pcVar2,(ulong)pcVar1);
      std::__cxx11::string::_M_replace((ulong)&local_2e0,0,local_2d8,0x10731e);
    }
    pcVar1 = (this->super_ServerOperation).SUCCESS;
    pcVar2 = (char *)(this->super_ServerOperation).statusMessage._M_string_length;
    strlen(pcVar1);
    std::__cxx11::string::_M_replace
              ((ulong)&(this->super_ServerOperation).statusMessage,0,pcVar2,(ulong)pcVar1);
    closedir(__dirp);
    (local_280->_M_dataplus)._M_p = (pointer)&local_280->field_2;
    if (local_2e0._M_p == &local_2d0) {
      (local_280->field_2)._M_allocated_capacity = CONCAT71(uStack_2cf,local_2d0);
      *(undefined8 *)((long)&local_280->field_2 + 8) = uStack_2c8;
    }
    else {
      (local_280->_M_dataplus)._M_p = local_2e0._M_p;
      (local_280->field_2)._M_allocated_capacity = CONCAT71(uStack_2cf,local_2d0);
    }
    local_280->_M_string_length = (size_type)local_2d8;
    local_2d8 = (char *)0x0;
    local_2d0 = '\0';
    psVar9 = local_280;
    local_2e0._M_p = &local_2d0;
  }
  if (local_2c0 != local_2b0) {
    operator_delete(local_2c0);
  }
  std::ifstream::~ifstream(&local_238);
  if (local_278 != &local_268) {
    operator_delete(local_278);
  }
  if (local_2e0._M_p != &local_2d0) {
    operator_delete(local_2e0._M_p);
  }
  return psVar9;
}

Assistant:

string ReadMessage::execute() {
    string result = "";
    int count = 0;
    string dir = string(MESSAGEDIR) + "/" + User;

    DIR* userDir = opendir(dir.c_str()); //Open User Directory

    struct dirent * userDirEntry; //individual entries in the directory.
    ifstream messageFile;
    string line;

    //if no directory found return 0
    if(userDir == nullptr){
        statusMessage = FAILURE;
        closedir(userDir);
        return "No such User \"" + User + "\" found\n";
    }

    //while directory isn't empty or didn't reach right file keep looking:
    while((userDirEntry = readdir(userDir)) != nullptr && count <= MessageNumber){
        //only read regular files
        if(userDirEntry->d_type == DT_REG){
            //ToDo: look if filename ends with .msg or .txt
            messageFile.open(dir + "/" + userDirEntry->d_name);
            if(messageFile.is_open()){
                //count as countable file
                count ++;
                if(count == MessageNumber){
                    //reading if reached right file
                    while(!messageFile.eof()){
                        //read till the end and save lines to the result:
                        getline(messageFile, line);
                        result.append(line);
                        result.append("\n");
                    }
                }
                //close file again
                messageFile.close();
            }
        }
    }

    if(result == ""){
        statusMessage = FAILURE;
        result = "No matching file found.\n";
    }

    statusMessage = SUCCESS;
    closedir(userDir);
    return result;
}